

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O1

void __thiscall helics::Input::getValue_impl<bool>(Input *this,bool *param_2)

{
  DataType baseType;
  bool bVar1;
  defV val;
  data_view dv;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_68;
  undefined1 local_40;
  data_view local_38;
  
  checkAndGetFedUpdate(&local_38,this);
  if (local_38.dblock._M_len == 0) {
LAB_0024c318:
    helics::valueExtract(&this->lastValue,param_2);
  }
  else {
    if (this->injectionType == HELICS_UNKNOWN) {
      loadSourceInformation(this);
    }
    baseType = this->injectionType;
    if (baseType == HELICS_INT) {
      local_68._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
      local_40 = 0;
      integerExtractAndConvert
                ((defV *)&local_68._M_first,&local_38,&this->inputUnits,&this->outputUnits);
      helics::valueExtract((defV *)&local_68._M_first,param_2);
LAB_0024c2d0:
      CLI::std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&local_68._M_first);
    }
    else {
      if (baseType == HELICS_DOUBLE) {
        local_68._M_first._M_storage =
             (_Uninitialized<double,_true>)
             doubleExtractAndConvert(&local_38,&this->inputUnits,&this->outputUnits);
        local_40 = 0;
        helics::valueExtract((defV *)&local_68._M_first,param_2);
        goto LAB_0024c2d0;
      }
      helics::valueExtract(&local_38,baseType,param_2);
    }
    if (this->changeDetectionEnabled == true) {
      bVar1 = changeDetected(&this->lastValue,*param_2,this->delta);
      if (!bVar1) goto LAB_0024c318;
      local_68._0_1_ = *param_2;
    }
    else {
      local_68._0_1_ = *param_2;
    }
    local_68._1_7_ = 0;
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->lastValue,(long *)&local_68._M_first);
  }
  this->hasUpdate = false;
  if (local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void Input::getValue_impl(std::integral_constant<int, primaryType> /*V*/, X& out)
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (injectionType == helics::DataType::HELICS_DOUBLE) {
            defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else if (injectionType == helics::DataType::HELICS_INT) {
            defV val;
            integerExtractAndConvert(val, dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else {
            valueExtract(dv, injectionType, out);
        }
        if (changeDetectionEnabled) {
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(out);
            } else {
                valueExtract(lastValue, out);
            }
        } else {
            lastValue = make_valid(out);
        }
    } else {
        valueExtract(lastValue, out);
    }
    hasUpdate = false;
}